

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O0

void read_fare_attributes
               (fare_attributes_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  payment_method_t pVar2;
  transfers_state_t tVar3;
  double dVar4;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  fare_attributes_t *record_local;
  
  init_fare_attributes(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"fare_id");
    if (iVar1 == 0) {
      strcpy(record->fare_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"price");
      if (iVar1 == 0) {
        dVar4 = atof(field_values[local_2c]);
        record->price = dVar4;
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"currency_type");
        if (iVar1 == 0) {
          strcpy(record->currency_type,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"payment_method");
          if (iVar1 == 0) {
            pVar2 = parse_payment_method(field_values[local_2c]);
            record->payment_method = pVar2;
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"transfers");
            if (iVar1 == 0) {
              tVar3 = parse_transfer_state(field_values[local_2c]);
              record->transfers = tVar3;
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"agency_id");
              if (iVar1 == 0) {
                strcpy(record->agency_id,field_values[local_2c]);
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"transfer_duration");
                if (iVar1 == 0) {
                  dVar4 = strtod(field_values[local_2c],(char **)0x0);
                  record->transfer_duration = dVar4;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_fare_attributes(fare_attributes_t *record, int field_count, const char **field_names, const char **field_values) {
    init_fare_attributes(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "fare_id") == 0) {
            strcpy(record->fare_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "price") == 0) {
            record->price = atof(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "currency_type") == 0) {
            strcpy(record->currency_type, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "payment_method") == 0) {
            record->payment_method = parse_payment_method(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfers") == 0) {
            record->transfers = parse_transfer_state(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->agency_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfer_duration") == 0) {
            record->transfer_duration = strtod(field_values[i], NULL);
            continue;
        }
    }
}